

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O2

int dorub(obj *obj)

{
  short sVar1;
  obj *poVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  char *line;
  
  if (obj == (obj *)0x0) {
    obj = getobj("\x06\r","rub",(obj **)0x0);
    if (obj == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar3 = validate_object(obj,"\x06\r","rub");
    if (bVar3 == '\0') {
      return 0;
    }
  }
  sVar1 = obj->otyp;
  if (obj->oclass == '\r') {
    if ((ushort)(sVar1 - 0x20fU) < 4) {
      iVar4 = use_stone(obj);
      return iVar4;
    }
    pline("Sorry, I don\'t know how to use that.");
    return 0;
  }
  if (sVar1 == 0xe7) {
    bVar3 = wield_tool(obj,"rub");
    if (bVar3 == '\0') {
      return 0;
    }
    pline("Rubbing the electric lamp is not particularly rewarding.");
    line = "Anyway, nothing exciting happens.";
    goto LAB_001411bb;
  }
  if (sVar1 == 0xe8) {
    bVar3 = wield_tool(obj,"rub");
    if (bVar3 == '\0') {
      return 0;
    }
  }
  else if (sVar1 == 0xe9) {
    bVar3 = wield_tool(obj,"rub");
    if (bVar3 == '\0') {
      return 0;
    }
    if (('\0' < uwep->spe) && (uVar5 = mt_random(), uVar5 % 3 == 0)) {
      check_unpaid_usage(uwep,'\x01');
      djinni_from_bottle(uwep);
      discover_object(0xe9,'\x01','\x01');
      poVar2 = uwep;
      uwep->otyp = 0xe8;
      poVar2->spe = '\0';
      uVar5 = mt_random();
      poVar2 = uwep;
      uwep->age = uVar5 % 500 + 1000;
      if ((poVar2->field_0x4c & 8) != 0) {
        begin_burn(level,poVar2,'\x01');
      }
      update_inventory();
      return 1;
    }
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00141152;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014114d;
LAB_0014125e:
        line = "You see a puff of smoke.";
        goto LAB_001411bb;
      }
LAB_0014114d:
      if (ublindf != (obj *)0x0) {
LAB_00141152:
        if (ublindf->oartifact == '\x1d') goto LAB_0014125e;
      }
    }
  }
  line = "Nothing happens.";
LAB_001411bb:
  pline(line);
  return 1;
}

Assistant:

int dorub(struct obj *obj)
{
	if (obj && !validate_object(obj, cuddly, "rub"))
	    return 0;
	else if (!obj)
	    obj = getobj(cuddly, "rub", NULL);

        if (!obj) return 0;

	if (obj->oclass == GEM_CLASS) {
	    if (is_graystone(obj)) {
		return use_stone(obj);
	    } else {
		pline("Sorry, I don't know how to use that.");
		return 0;
	    }
	}

	if (obj->otyp == MAGIC_LAMP) {
            if (!wield_tool(obj, "rub")) return 0;
	    if (uwep->spe > 0 && !rn2(3)) {
		check_unpaid_usage(uwep, TRUE);		/* unusual item use */
		djinni_from_bottle(uwep);
		makeknown(MAGIC_LAMP);
		uwep->otyp = OIL_LAMP;
		uwep->spe = 0; /* for safety */
		uwep->age = rn1(500,1000);
		if (uwep->lamplit) begin_burn(level, uwep, TRUE);
		update_inventory();
	    } else if (rn2(2) && !Blind)
		pline("You see a puff of smoke.");
	    else pline("Nothing happens.");
	} else if (obj->otyp == BRASS_LANTERN) {
            if (!wield_tool(obj, "rub")) return 0;
	    /* message from Adventure */
	    pline("Rubbing the electric lamp is not particularly rewarding.");
	    pline("Anyway, nothing exciting happens.");
        } else if (obj->otyp == OIL_LAMP) {
            if (!wield_tool(obj,"rub")) return 0;
            pline("Nothing happens.");
	} else pline("Nothing happens.");
	return 1;
}